

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

_Bool art_node_init_iterator(art_node_t *node,art_iterator_t *iterator,_Bool first)

{
  byte bVar1;
  undefined4 uVar2;
  unkbyte9 Var3;
  art_val_t *paVar4;
  art_indexed_child_t aVar5;
  
  while (((ulong)node & 1) == 0) {
    if (first) {
      aVar5 = art_node_next_child(node,-1);
      Var3 = aVar5._0_9_;
    }
    else {
      aVar5 = art_node_prev_child(node,0x100);
      Var3 = aVar5._0_9_;
    }
    art_iterator_down(iterator,(art_inner_node_t *)node,(uint8_t)((unkuint9)Var3 >> 0x40));
    node = (art_node_t *)Var3;
  }
  bVar1 = iterator->frame;
  iterator->frames[bVar1].node = node;
  paVar4 = (art_val_t *)((ulong)node & 0xfffffffffffffffe);
  iterator->frames[bVar1].index_in_node = '\0';
  *(undefined2 *)(iterator->key + 4) = *(undefined2 *)(paVar4->key + 4);
  uVar2 = *(undefined4 *)paVar4->key;
  *(undefined4 *)iterator->key = uVar2;
  iterator->value = paVar4;
  return SUB41(uVar2,0);
}

Assistant:

static bool art_node_init_iterator(const art_node_t *node,
                                   art_iterator_t *iterator, bool first) {
    while (!art_is_leaf(node)) {
        art_indexed_child_t indexed_child;
        if (first) {
            indexed_child = art_node_next_child(node, -1);
        } else {
            indexed_child = art_node_prev_child(node, 256);
        }
        art_iterator_down(iterator, (art_inner_node_t *)node,
                          indexed_child.index);
        node = indexed_child.child;
    }
    // We're at a leaf.
    iterator->frames[iterator->frame].node = (art_node_t *)node;
    iterator->frames[iterator->frame].index_in_node = 0;  // Should not matter.
    return art_iterator_valid_loc(iterator, CAST_LEAF(node));
}